

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

int __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::NConnectShapeF
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,int connect,int order)

{
  int iVar1;
  
  if (this->fhdivfam == EHDivConstant) {
    iVar1 = TPZShapeHDivConstant<pzshape::TPZShapePrism>::ComputeNConnectShapeF(connect,order);
    return iVar1;
  }
  if (this->fhdivfam == EHDivStandard) {
    iVar1 = TPZShapeHDiv<pzshape::TPZShapePrism>::ComputeNConnectShapeF(connect,order);
    return iVar1;
  }
  return -1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::NConnectShapeF(int connect, int order)const
{
#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        return TPZShapeHDiv<TSHAPE>::ComputeNConnectShapeF(connect,order);    
        break;
    case HDivFamily::EHDivConstant:
        return TPZShapeHDivConstant<TSHAPE>::ComputeNConnectShapeF(connect,order);
        break;
    
    default:
        return -1;
        break;
    }
    return -1;
 }